

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

tmsize_t TIFFWriteRawTile(TIFF *tif,uint32_t tile,void *data,tmsize_t cc)

{
  int iVar1;
  TIFF *local_38;
  tmsize_t cc_local;
  void *data_local;
  uint32_t tile_local;
  TIFF *tif_local;
  
  if (((tif->tif_flags & 0x40) == 0) &&
     (iVar1 = TIFFWriteCheck(tif,1,"TIFFWriteRawTile"), iVar1 == 0)) {
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  else if (tile < (tif->tif_dir).td_nstrips) {
    iVar1 = TIFFAppendToStrip(tif,tile,(uint8_t *)data,cc);
    local_38 = (TIFF *)cc;
    if (iVar1 == 0) {
      local_38 = (TIFF *)0xffffffffffffffff;
    }
    tif_local = local_38;
  }
  else {
    TIFFErrorExtR(tif,"TIFFWriteRawTile","Tile %lu out of range, max %lu",(ulong)tile,
                  (ulong)(tif->tif_dir).td_nstrips);
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  return (tmsize_t)tif_local;
}

Assistant:

tmsize_t TIFFWriteRawTile(TIFF *tif, uint32_t tile, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteRawTile";

    if (!WRITECHECKTILES(tif, module))
        return ((tmsize_t)(-1));
    if (tile >= tif->tif_dir.td_nstrips)
    {
        TIFFErrorExtR(tif, module, "Tile %lu out of range, max %lu",
                      (unsigned long)tile,
                      (unsigned long)tif->tif_dir.td_nstrips);
        return ((tmsize_t)(-1));
    }
    return (TIFFAppendToStrip(tif, tile, (uint8_t *)data, cc) ? cc
                                                              : (tmsize_t)(-1));
}